

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O2

void __thiscall
duckdb::StreamingWindowState::StreamingWindowState(StreamingWindowState *this,ClientContext *client)

{
  Allocator *pAVar1;
  
  (this->super_OperatorState)._vptr_OperatorState =
       (_func_int **)&PTR__StreamingWindowState_0179e170;
  this->initialized = false;
  (this->const_vectors).
  super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->const_vectors).
  super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->const_vectors).
  super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aggregate_states).
  super_vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aggregate_states).
  super_vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aggregate_states).
  super_vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pAVar1 = Allocator::Get(client);
  this->allocator = pAVar1;
  (this->lead_lag_states).
  super_vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lead_lag_states).
  super_vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lead_lag_states).
  super_vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->lead_count = 0;
  DataChunk::DataChunk(&this->delayed);
  DataChunk::DataChunk(&this->shifted);
  return;
}

Assistant:

explicit StreamingWindowState(ClientContext &client) : initialized(false), allocator(Allocator::Get(client)) {
	}